

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

void Abc_NtkStrashPerformAig(Abc_Ntk_t *pNtk,Ivy_Man_t *pMan)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNode_00;
  Ivy_Obj_t *pIVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Ivy_Man_t *pMan_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_NtkDfs(pNtk,0);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pNode_00 = (Abc_Obj_t *)Vec_PtrEntry(p,local_2c);
    pIVar2 = Abc_NodeStrashAig(pMan,pNode_00);
    (pNode_00->field_6).pCopy = (Abc_Obj_t *)pIVar2;
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkStrashPerformAig( Abc_Ntk_t * pNtk, Ivy_Man_t * pMan )
{
//    ProgressBar * pProgress;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    vNodes = Abc_NtkDfs( pNtk, 0 );
//    pProgress = Extra_ProgressBarStart( stdout, vNodes->nSize );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
//        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeStrashAig( pMan, pNode );
    }
//    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );
}